

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::dispose
          (ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *this)

{
  Maybe<kj::Own<capnp::ClientHook>_> *firstElement;
  RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *pRVar1;
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar2;
  Maybe<kj::Own<capnp::ClientHook>_> *endCopy;
  Maybe<kj::Own<capnp::ClientHook>_> *posCopy;
  Maybe<kj::Own<capnp::ClientHook>_> *ptrCopy;
  ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pMVar2 = this->endPtr;
  if (firstElement != (Maybe<kj::Own<capnp::ClientHook>_> *)0x0) {
    this->ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
    this->pos = (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x0;
    this->endPtr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
    ArrayDisposer::dispose<kj::Maybe<kj::Own<capnp::ClientHook>>>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 4,
               (long)pMVar2 - (long)firstElement >> 4);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }